

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,vector<bool,_std::allocator<bool>_> *v)

{
  value_type *__x;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_80;
  undefined1 local_50 [8];
  optional<std::vector<bool,_std::allocator<bool>_>_> ret;
  vector<bool,_std::allocator<bool>_> *v_local;
  Attribute *this_local;
  
  if (v == (vector<bool,_std::allocator<bool>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._32_8_ = v;
    primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_80,&this->_var);
    nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::
    optional<std::vector<bool,_std::allocator<bool>_>,_0>
              ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_50,&local_80);
    nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional(&local_80)
    ;
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_50);
    if (this_local._7_1_) {
      __x = nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::value
                      ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_50);
      ::std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)ret.contained._32_8_,__x);
    }
    nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
              ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }